

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerNewRegEx(Lowerer *this,Instr *instr)

{
  uint32 uVar1;
  Sym *sym;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  DWORD DVar7;
  undefined4 *puVar8;
  Opnd *pOVar9;
  SymOpnd *pSVar10;
  SymOpnd *pSStack_48;
  bool isZeroed;
  SymOpnd *tempObjectSymOpnd;
  RegOpnd *dstOpnd;
  Instr *instrPrev;
  Instr *instrPrev_1;
  Opnd *src1;
  Instr *instr_local;
  Lowerer *this_local;
  
  src1 = (Opnd *)instr;
  instr_local = (Instr *)this;
  instrPrev_1 = (Instr *)IR::Instr::UnlinkSrc1(instr);
  bVar3 = IR::Opnd::IsAddrOpnd((Opnd *)instrPrev_1);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2f14,"(src1->IsAddrOpnd())","src1->IsAddrOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if ((DAT_01ec73d8 & 1) != 0) {
    pOVar9 = IR::Instr::GetDst((Instr *)src1);
    bVar3 = IR::Opnd::CanStoreTemp(pOVar9);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2f19,"(!instr->GetDst()->CanStoreTemp())",
                         "!instr->GetDst()->CanStoreTemp()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    instrPrev = LoadScriptContext(this,(Instr *)src1);
    instrPrev = LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)src1,(Opnd *)instrPrev_1);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,(Instr *)src1,HelperScrRegEx_OP_NewRegEx,(LabelInstr *)0x0,
               (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
    return instrPrev;
  }
  dstOpnd = *(RegOpnd **)&src1[1].m_valueType;
  pOVar9 = IR::Instr::UnlinkDst((Instr *)src1);
  tempObjectSymOpnd = (SymOpnd *)IR::Opnd::AsRegOpnd(pOVar9);
  bVar3 = GenerateRecyclerOrMarkTempAlloc
                    (this,(Instr *)src1,(RegOpnd *)tempObjectSymOpnd,
                     HelperAllocMemForJavascriptRegExp,0x40,&stack0xffffffffffffffb8);
  if (pSStack_48 == (SymOpnd *)0x0) {
LAB_007962e2:
    pSVar10 = tempObjectSymOpnd;
    pOVar9 = LoadVTableValueOpnd(this,(Instr *)src1,VtableJavascriptRegExp);
    GenerateMemInit(this,(RegOpnd *)pSVar10,0,pOVar9,(Instr *)src1,bVar3);
  }
  else {
    uVar5 = Func::GetSourceContextId(this->m_func);
    uVar6 = Func::GetLocalFunctionId(this->m_func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,HoistMarkTempInitPhase,uVar5,uVar6);
    pSVar10 = pSStack_48;
    if ((bVar4) || (this->outerMostLoopLabel == (LabelInstr *)0x0)) goto LAB_007962e2;
    pOVar9 = LoadVTableValueOpnd(this,&this->outerMostLoopLabel->super_Instr,VtableJavascriptRegExp)
    ;
    InsertMove(&pSVar10->super_Opnd,pOVar9,&this->outerMostLoopLabel->super_Instr,false);
  }
  pSVar10 = tempObjectSymOpnd;
  DVar7 = Js::DynamicObject::GetOffsetOfType();
  pOVar9 = LoadLibraryValueOpnd(this,(Instr *)src1,ValueRegexType);
  GenerateMemInit(this,(RegOpnd *)pSVar10,DVar7,pOVar9,(Instr *)src1,bVar3);
  pSVar10 = tempObjectSymOpnd;
  DVar7 = Js::DynamicObject::GetOffsetOfAuxSlots();
  GenerateMemInitNull(this,(RegOpnd *)pSVar10,DVar7,(Instr *)src1,bVar3);
  pSVar10 = tempObjectSymOpnd;
  DVar7 = Js::DynamicObject::GetOffsetOfObjectArray();
  GenerateMemInitNull(this,(RegOpnd *)pSVar10,DVar7,(Instr *)src1,bVar3);
  if (pSStack_48 != (SymOpnd *)0x0) {
    uVar5 = Func::GetSourceContextId(this->m_func);
    uVar6 = Func::GetLocalFunctionId(this->m_func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,HoistMarkTempInitPhase,uVar5,uVar6);
    if ((!bVar4) && (this->outerMostLoopLabel != (LabelInstr *)0x0)) {
      sym = pSStack_48->m_sym;
      uVar1 = pSStack_48->m_offset;
      uVar5 = Js::JavascriptRegExp::GetOffsetOfPattern();
      pSVar10 = IR::SymOpnd::New(sym,uVar1 + uVar5,TyUint64,this->m_func);
      InsertMove(&pSVar10->super_Opnd,(Opnd *)instrPrev_1,&this->outerMostLoopLabel->super_Instr,
                 false);
      goto LAB_007964a3;
    }
  }
  pSVar10 = tempObjectSymOpnd;
  uVar5 = Js::JavascriptRegExp::GetOffsetOfPattern();
  GenerateMemInit(this,(RegOpnd *)pSVar10,uVar5,(Opnd *)instrPrev_1,(Instr *)src1,bVar3);
LAB_007964a3:
  pSVar10 = tempObjectSymOpnd;
  uVar5 = Js::JavascriptRegExp::GetOffsetOfSplitPattern();
  GenerateMemInitNull(this,(RegOpnd *)pSVar10,uVar5,(Instr *)src1,bVar3);
  pSVar10 = tempObjectSymOpnd;
  uVar5 = Js::JavascriptRegExp::GetOffsetOfLastIndexVar();
  GenerateMemInitNull(this,(RegOpnd *)pSVar10,uVar5,(Instr *)src1,bVar3);
  pSVar10 = tempObjectSymOpnd;
  uVar5 = Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag();
  GenerateMemInit(this,(RegOpnd *)pSVar10,uVar5,0,(Instr *)src1,bVar3);
  IR::Instr::Remove((Instr *)src1);
  return (Instr *)dstOpnd;
}

Assistant:

IR::Instr *
Lowerer::LowerNewRegEx(IR::Instr * instr)
{
    IR::Opnd *src1 = instr->UnlinkSrc1();

    Assert(src1->IsAddrOpnd());

#if ENABLE_REGEX_CONFIG_OPTIONS
    if (REGEX_CONFIG_FLAG(RegexTracing))
    {
        Assert(!instr->GetDst()->CanStoreTemp());
        IR::Instr * instrPrev = LoadScriptContext(instr);
        instrPrev = m_lowererMD.LoadHelperArgument(instr, src1);
        m_lowererMD.ChangeToHelperCall(instr, IR::HelperScrRegEx_OP_NewRegEx);
        return instrPrev;
    }
#endif
    IR::Instr * instrPrev = instr->m_prev;
    IR::RegOpnd * dstOpnd = instr->UnlinkDst()->AsRegOpnd();
    IR::SymOpnd * tempObjectSymOpnd;
    bool isZeroed = GenerateRecyclerOrMarkTempAlloc(instr, dstOpnd, IR::HelperAllocMemForJavascriptRegExp, sizeof(Js::JavascriptRegExp), &tempObjectSymOpnd);
    if (tempObjectSymOpnd && !PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func) && this->outerMostLoopLabel)
    {
        // Hoist the vtable and pattern init to the outer most loop top as it never changes
        InsertMove(tempObjectSymOpnd,
            LoadVTableValueOpnd(this->outerMostLoopLabel, VTableValue::VtableJavascriptRegExp),
            this->outerMostLoopLabel, false);
    }
    else
    {
        GenerateMemInit(dstOpnd, 0, LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp), instr, isZeroed);
    }
    GenerateMemInit(dstOpnd, Js::JavascriptRegExp::GetOffsetOfType(),
        this->LoadLibraryValueOpnd(instr, LibraryValue::ValueRegexType), instr, isZeroed);
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfAuxSlots(), instr, isZeroed);
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfObjectArray(), instr, isZeroed);
    if (tempObjectSymOpnd && !PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func) && this->outerMostLoopLabel)
    {
        InsertMove(IR::SymOpnd::New(tempObjectSymOpnd->m_sym,
            tempObjectSymOpnd->m_offset + Js::JavascriptRegExp::GetOffsetOfPattern(), TyMachPtr, this->m_func),
            src1, this->outerMostLoopLabel, false);
    }
    else
    {
        GenerateMemInit(dstOpnd, Js::JavascriptRegExp::GetOffsetOfPattern(), src1, instr, isZeroed);
    }
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfSplitPattern(), instr, isZeroed);
    GenerateMemInitNull(dstOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexVar(), instr, isZeroed);
    GenerateMemInit(dstOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag(), 0, instr, isZeroed);
    instr->Remove();

    return instrPrev;
}